

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Concatenate.cc
# Opt level: O2

void __thiscall Pl_Concatenate::Pl_Concatenate(Pl_Concatenate *this,char *identifier,Pipeline *next)

{
  logic_error *this_00;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Concatenate_002ac2e0;
  (this->m)._M_t.
  super___uniq_ptr_impl<Pl_Concatenate::Members,_std::default_delete<Pl_Concatenate::Members>_>._M_t
  .super__Tuple_impl<0UL,_Pl_Concatenate::Members_*,_std::default_delete<Pl_Concatenate::Members>_>.
  super__Head_base<0UL,_Pl_Concatenate::Members_*,_false>._M_head_impl = (Members *)0x0;
  if (next != (Pipeline *)0x0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Attempt to create Pl_Concatenate with nullptr as next");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pl_Concatenate::Pl_Concatenate(char const* identifier, Pipeline* next) :
    Pipeline(identifier, next)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_Concatenate with nullptr as next");
    }
}